

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O3

int asn1_template_ex_d2i
              (ASN1_VALUE **val,uchar **in,long inlen,ASN1_TEMPLATE *tt,char opt,CRYPTO_BUFFER *buf,
              int depth)

{
  int iVar1;
  int reason;
  int line;
  char cst;
  uchar *p;
  long len;
  uchar *local_38;
  
  if (val == (ASN1_VALUE **)0x0) {
    iVar1 = 0;
  }
  else {
    p = *in;
    if ((tt->flags & 0x10) == 0) {
      iVar1 = asn1_template_noexp_d2i(val,in,inlen,tt,opt,buf,depth);
      return iVar1;
    }
    iVar1 = asn1_check_tlen(&len,(int *)0x0,(uchar *)0x0,&cst,&p,inlen,tt->tag,tt->flags & 0xc0,opt)
    ;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        reason = 0x9e;
        line = 0x1e1;
      }
      else if (cst == '\0') {
        reason = 0x78;
        line = 0x1e7;
      }
      else {
        local_38 = p;
        iVar1 = asn1_template_noexp_d2i(val,&p,len,tt,'\0',buf,depth);
        if (iVar1 != 0) {
          len = (long)(local_38 + (len - (long)p));
          if ((uchar *)len != (uchar *)0x0) {
            ERR_put_error(0xc,0,0x77,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                          ,500);
            ASN1_template_free((ASN1_VALUE **)val,(ASN1_TEMPLATE *)tt);
            return 0;
          }
          *in = p;
          return 1;
        }
        reason = 0x9e;
        line = 0x1ed;
      }
      iVar1 = 0;
      ERR_put_error(0xc,0,reason,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,line);
    }
  }
  return iVar1;
}

Assistant:

static int asn1_template_ex_d2i(ASN1_VALUE **val, const unsigned char **in,
                                long inlen, const ASN1_TEMPLATE *tt, char opt,
                                CRYPTO_BUFFER *buf, int depth) {
  int aclass;
  int ret;
  long len;
  const unsigned char *p, *q;
  if (!val) {
    return 0;
  }
  uint32_t flags = tt->flags;
  aclass = flags & ASN1_TFLG_TAG_CLASS;

  p = *in;

  // Check if EXPLICIT tag expected
  if (flags & ASN1_TFLG_EXPTAG) {
    char cst;
    // Need to work out amount of data available to the inner content and
    // where it starts: so read in EXPLICIT header to get the info.
    ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, inlen, tt->tag, aclass,
                          opt);
    q = p;
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    } else if (ret == -1) {
      return -1;
    }
    if (!cst) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_EXPLICIT_TAG_NOT_CONSTRUCTED);
      return 0;
    }
    // We've found the field so it can't be OPTIONAL now
    ret = asn1_template_noexp_d2i(val, &p, len, tt, /*opt=*/0, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    }
    // We read the field in OK so update length
    len -= p - q;
    // Check for trailing data.
    if (len) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_EXPLICIT_LENGTH_MISMATCH);
      goto err;
    }
  } else {
    return asn1_template_noexp_d2i(val, in, inlen, tt, opt, buf, depth);
  }

  *in = p;
  return 1;

err:
  ASN1_template_free(val, tt);
  return 0;
}